

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O3

ClipResult __thiscall Text::clip_position(Text *this,Point position)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint column;
  uint row;
  ulong uVar6;
  ulong uVar7;
  ClipResult CVar8;
  Point local_20 [2];
  
  row = position.row;
  uVar6 = (ulong)position & 0xffffffff;
  puVar1 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar2 - (long)puVar1;
  uVar7 = (long)uVar3 >> 2;
  if (uVar6 < uVar7) {
    if (uVar6 == uVar7 - 1) {
      uVar4 = (uint)(this->content)._M_string_length;
    }
    else {
      uVar4 = puVar1[row + 1] - 1;
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar5 = puVar1[row + 1] - 2;
        if ((this->content)._M_dataplus._M_p[uVar5] == L'\r') {
          uVar4 = uVar5;
        }
      }
    }
    column = uVar4 - puVar1[uVar6];
    uVar5 = position.column;
    if (column < uVar5) {
      Point::Point(local_20,row,column);
    }
    else {
      uVar4 = puVar1[uVar6] + uVar5;
      local_20[0].row = row;
      local_20[0].column = uVar5;
    }
  }
  else {
    Point::Point(local_20,(int)(uVar3 >> 2) - 1,(int)(this->content)._M_string_length - puVar2[-1]);
    uVar4 = (uint)(this->content)._M_string_length;
  }
  CVar8.position.column = local_20[0].column;
  CVar8.position.row = local_20[0].row;
  CVar8.offset = uVar4;
  return CVar8;
}

Assistant:

ClipResult Text::clip_position(Point position) const {
  uint32_t row = position.row;
  if (row >= line_offsets.size()) {
    return {extent(), size()};
  } else {
    uint32_t start = line_offsets[row];
    uint32_t end;
    if (row == line_offsets.size() - 1) {
      end = content.size();
    } else {
      end = line_offsets[row + 1] - 1;
      if (end > 0 && content[end - 1] == '\r') {
        end--;
      }
    }
    if (position.column > end - start) {
      return {Point(row, end - start), end};
    } else {
      return {position, start + position.column};
    }
  }
}